

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O2

uint32_t * pack8_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  uVar2 = (in[1] - base) * 0x100 | uVar1 - base;
  *out = uVar2;
  uVar2 = (in[2] - base) * 0x10000 | uVar2;
  *out = uVar2;
  *out = (in[3] - base) * 0x1000000 | uVar2;
  uVar1 = in[4];
  out[1] = uVar1 - base;
  uVar2 = (in[5] - base) * 0x100 | uVar1 - base;
  out[1] = uVar2;
  uVar2 = (in[6] - base) * 0x10000 | uVar2;
  out[1] = uVar2;
  out[1] = (in[7] - base) * 0x1000000 | uVar2;
  uVar1 = in[8];
  out[2] = uVar1 - base;
  uVar2 = (in[9] - base) * 0x100 | uVar1 - base;
  out[2] = uVar2;
  uVar2 = (in[10] - base) * 0x10000 | uVar2;
  out[2] = uVar2;
  out[2] = (in[0xb] - base) * 0x1000000 | uVar2;
  uVar1 = in[0xc];
  out[3] = uVar1 - base;
  uVar2 = (in[0xd] - base) * 0x100 | uVar1 - base;
  out[3] = uVar2;
  uVar2 = (in[0xe] - base) * 0x10000 | uVar2;
  out[3] = uVar2;
  out[3] = (in[0xf] - base) * 0x1000000 | uVar2;
  return out + 4;
}

Assistant:

uint32_t * pack8_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    ++in;
    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    ++in;
    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    ++in;
    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    ++in;

    return out;
}